

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CopyClassExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CopyClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,NameSyntax *args,ExpressionSyntax *args_1)

{
  CopyClassExpressionSyntax *pCVar1;
  
  pCVar1 = (CopyClassExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CopyClassExpressionSyntax *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (CopyClassExpressionSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  (pCVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar1->super_ExpressionSyntax).super_SyntaxNode.kind = CopyClassExpression;
  (pCVar1->scopedNew).ptr = args;
  (pCVar1->expr).ptr = args_1;
  (args->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pCVar1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pCVar1;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }